

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPToken cp_ident(CPState *cp)

{
  byte *pbVar1;
  CTypeID CVar2;
  uint uVar3;
  GCstr *pGVar4;
  uint *puVar5;
  uint *in_RDI;
  char *in_stack_00000008;
  lua_State *in_stack_00000010;
  char *p;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_50;
  char *local_18;
  
  do {
    uVar3 = *in_RDI;
    puVar5 = in_RDI + 10;
    if (in_RDI[0xb] == *puVar5) {
      local_18 = lj_buf_more2((SBuf *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (MSize)((ulong)in_RDI >> 0x20));
    }
    else {
      local_18 = (char *)(ulong)*puVar5;
    }
    *local_18 = (char)uVar3;
    *puVar5 = (int)local_18 + 1;
    pbVar1 = *(byte **)(in_RDI + 8);
    *(byte **)(in_RDI + 8) = pbVar1 + 1;
    *in_RDI = (uint)*pbVar1;
    if (*in_RDI == 0x5c) {
      local_50 = cp_get_bs((CPState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    else {
      local_50 = *in_RDI;
    }
  } while ((""[(long)(int)local_50 + 1] & 0x80) != 0);
  pGVar4 = lj_str_new(in_stack_00000010,in_stack_00000008,(size_t)cp);
  *(GCstr **)(in_RDI + 4) = pGVar4;
  CVar2 = lj_ctype_getname(*(CTState **)(in_RDI + 0x10),(CType **)(in_RDI + 6),
                           *(GCstr **)(in_RDI + 4),in_RDI[0x18]);
  in_RDI[3] = CVar2;
  if (**(uint **)(in_RDI + 6) >> 0x1c == 0xd) {
    uVar3 = **(uint **)(in_RDI + 6) & 0xffff;
  }
  else {
    uVar3 = 0x100;
  }
  return uVar3;
}

Assistant:

static CPToken cp_ident(CPState *cp)
{
  do { cp_save(cp, cp->c); } while (lj_char_isident(cp_get(cp)));
  cp->str = lj_buf_str(cp->L, &cp->sb);
  cp->val.id = lj_ctype_getname(cp->cts, &cp->ct, cp->str, cp->tmask);
  if (ctype_type(cp->ct->info) == CT_KW)
    return ctype_cid(cp->ct->info);
  return CTOK_IDENT;
}